

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O0

_Bool mi_bitmap_try_find_claim_field_across
                (mi_bitmap_t bitmap,size_t bitmap_fields,size_t idx,size_t count,size_t retries,
                mi_bitmap_index_t *bitmap_idx)

{
  size_t *psVar1;
  ulong uVar2;
  _Bool _Var3;
  size_t sVar4;
  uintptr_t uVar5;
  size_t sVar6;
  mi_bitmap_index_t mVar7;
  ulong in_RCX;
  size_t in_RDX;
  mi_bitmap_t in_RSI;
  long in_RDI;
  ulong in_R8;
  mi_bitmap_index_t *in_R9;
  bool bVar8;
  size_t newmap;
  size_t initial_mask;
  size_t initial_idx;
  mi_bitmap_field_t *initial_field;
  size_t final_mask;
  mi_bitmap_field_t *final_field;
  size_t mask_bits;
  size_t mask;
  size_t found;
  size_t initial;
  size_t map;
  mi_bitmap_field_t *field;
  size_t in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  size_t local_110;
  mi_bitmap_index_t *in_stack_ffffffffffffff20;
  size_t in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  mi_bitmap_t in_stack_ffffffffffffff38;
  ulong local_68;
  ulong local_60;
  ulong local_48;
  size_t *psVar9;
  mi_bitmap_index_t *bitmap_idx_00;
  _Bool local_1;
  
  psVar9 = (size_t *)(in_RDI + in_RDX * 8);
  sVar4 = mi_clz(*psVar9);
  if (sVar4 == 0) {
    local_1 = false;
  }
  else if (sVar4 < in_RCX) {
    uVar5 = _mi_divide_up(in_RCX - sVar4,0x40);
    if (uVar5 < (long)in_RSI - in_RDX) {
      local_68 = 0;
      for (local_60 = sVar4; local_60 < in_RCX; local_60 = local_110 + local_60) {
        psVar9 = psVar9 + 1;
        uVar2 = *psVar9;
        if (in_RCX < local_60 + 0x40) {
          local_110 = in_RCX - local_60;
        }
        else {
          local_110 = 0x40;
        }
        local_68 = mi_bitmap_mask_(local_110,0);
        if ((uVar2 & local_68) != 0) {
          return false;
        }
      }
      psVar1 = (size_t *)(in_RDI + in_RDX * 8);
      sVar4 = mi_bitmap_mask_(sVar4,0x40 - sVar4);
      local_48 = *psVar1;
      do {
        bitmap_idx_00 = psVar1;
        if ((local_48 & sVar4) != 0) goto LAB_0046cc91;
        LOCK();
        sVar6 = *psVar1;
        bVar8 = local_48 == sVar6;
        if (bVar8) {
          *psVar1 = local_48 | sVar4;
          sVar6 = local_48;
        }
        UNLOCK();
        local_48 = sVar6;
      } while (!bVar8);
      while (bitmap_idx_00 = bitmap_idx_00 + 1, bitmap_idx_00 < psVar9) {
        LOCK();
        sVar6 = *bitmap_idx_00;
        if (sVar6 == 0) {
          *bitmap_idx_00 = 0xffffffffffffffff;
        }
        UNLOCK();
        if (sVar6 != 0) goto LAB_0046cc91;
      }
      local_48 = *bitmap_idx_00;
      while ((local_48 & local_68) == 0) {
        LOCK();
        sVar6 = *bitmap_idx_00;
        bVar8 = local_48 == sVar6;
        if (bVar8) {
          *bitmap_idx_00 = local_48 | local_68;
          sVar6 = local_48;
        }
        UNLOCK();
        local_48 = sVar6;
        if (bVar8) {
          mVar7 = mi_bitmap_index_create
                            (CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                             in_stack_fffffffffffffea8);
          *in_R9 = mVar7;
          return true;
        }
      }
LAB_0046cc91:
      while (bitmap_idx_00 = bitmap_idx_00 + -1, psVar1 < bitmap_idx_00) {
        *bitmap_idx_00 = 0;
      }
      if (bitmap_idx_00 == psVar1) {
        local_48 = *bitmap_idx_00;
        do {
          LOCK();
          mVar7 = *bitmap_idx_00;
          bVar8 = local_48 == mVar7;
          if (bVar8) {
            *bitmap_idx_00 = local_48 & (sVar4 ^ 0xffffffffffffffff);
            mVar7 = local_48;
          }
          UNLOCK();
          local_48 = mVar7;
        } while (!bVar8);
      }
      if (in_R8 < 3) {
        _Var3 = mi_bitmap_try_find_claim_field_across
                          (in_RSI,in_RDX,in_RCX,in_R8,(size_t)in_R9,bitmap_idx_00);
        return _Var3;
      }
      return false;
    }
    local_1 = false;
  }
  else {
    local_1 = _mi_bitmap_try_find_claim_field
                        (in_stack_ffffffffffffff38,
                         CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                         in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  }
  return local_1;
}

Assistant:

static bool mi_bitmap_try_find_claim_field_across(mi_bitmap_t bitmap, size_t bitmap_fields, size_t idx, const size_t count, const size_t retries, mi_bitmap_index_t* bitmap_idx)
{
  mi_assert_internal(bitmap_idx != NULL);

  // check initial trailing zeros
  mi_bitmap_field_t* field = &bitmap[idx];
  size_t map = mi_atomic_load_relaxed(field);
  const size_t initial = mi_clz(map);  // count of initial zeros starting at idx
  mi_assert_internal(initial <= MI_BITMAP_FIELD_BITS);
  if (initial == 0)     return false;
  if (initial >= count) return _mi_bitmap_try_find_claim_field(bitmap, idx, count, bitmap_idx);    // no need to cross fields (this case won't happen for us)
  if (_mi_divide_up(count - initial, MI_BITMAP_FIELD_BITS) >= (bitmap_fields - idx)) return false; // not enough entries

  // scan ahead
  size_t found = initial;
  size_t mask = 0;     // mask bits for the final field
  while(found < count) {
    field++;
    map = mi_atomic_load_relaxed(field);
    const size_t mask_bits = (found + MI_BITMAP_FIELD_BITS <= count ? MI_BITMAP_FIELD_BITS : (count - found));
    mi_assert_internal(mask_bits > 0 && mask_bits <= MI_BITMAP_FIELD_BITS);
    mask = mi_bitmap_mask_(mask_bits, 0);
    if ((map & mask) != 0) return false;  // some part is already claimed
    found += mask_bits;
  }
  mi_assert_internal(field < &bitmap[bitmap_fields]);

  // we found a range of contiguous zeros up to the final field; mask contains mask in the final field
  // now try to claim the range atomically
  mi_bitmap_field_t* const final_field = field;
  const size_t final_mask = mask;
  mi_bitmap_field_t* const initial_field = &bitmap[idx];
  const size_t initial_idx = MI_BITMAP_FIELD_BITS - initial;
  const size_t initial_mask = mi_bitmap_mask_(initial, initial_idx);

  // initial field
  size_t newmap;
  field = initial_field;
  map = mi_atomic_load_relaxed(field);
  do {
    newmap = (map | initial_mask);
    if ((map & initial_mask) != 0) { goto rollback; };
  } while (!mi_atomic_cas_strong_acq_rel(field, &map, newmap));

  // intermediate fields
  while (++field < final_field) {
    newmap = MI_BITMAP_FIELD_FULL;
    map = 0;
    if (!mi_atomic_cas_strong_acq_rel(field, &map, newmap)) { goto rollback; }
  }

  // final field
  mi_assert_internal(field == final_field);
  map = mi_atomic_load_relaxed(field);
  do {
    newmap = (map | final_mask);
    if ((map & final_mask) != 0) { goto rollback; }
  } while (!mi_atomic_cas_strong_acq_rel(field, &map, newmap));

  // claimed!
  *bitmap_idx = mi_bitmap_index_create(idx, initial_idx);
  return true;

rollback:
  // roll back intermediate fields
  // (we just failed to claim `field` so decrement first)
  while (--field > initial_field) {
    newmap = 0;
    map = MI_BITMAP_FIELD_FULL;
    mi_assert_internal(mi_atomic_load_relaxed(field) == map);
    mi_atomic_store_release(field, newmap);
  }
  if (field == initial_field) {               // (if we failed on the initial field, `field + 1 == initial_field`)
    map = mi_atomic_load_relaxed(field);
    do {
      mi_assert_internal((map & initial_mask) == initial_mask);
      newmap = (map & ~initial_mask);
    } while (!mi_atomic_cas_strong_acq_rel(field, &map, newmap));
  }
  mi_stat_counter_increase(_mi_stats_main.arena_rollback_count,1);
  // retry? (we make a recursive call instead of goto to be able to use const declarations)
  if (retries <= 2) {
    return mi_bitmap_try_find_claim_field_across(bitmap, bitmap_fields, idx, count, retries+1, bitmap_idx);
  }
  else {
    return false;
  }
}